

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O0

Array<float,_NUM_EDGES>
Rml::ElementHandleTargetData::ResolveEdgeMargin
          (Element *target,Box *box,Array<NumericValue,_NUM_EDGES> *edge_margin)

{
  NumericValue value;
  const_reference pvVar1;
  float *pfVar2;
  reference pvVar3;
  float value_00;
  Array<float,_NUM_EDGES> AVar4;
  value_type_conflict2 local_48;
  int local_3c;
  Vector2f VStack_38;
  int i;
  Vector2f target_size;
  Array<NumericValue,_NUM_EDGES> *edge_margin_local;
  Box *box_local;
  Element *target_local;
  Array<float,_NUM_EDGES> resolved_edge_margin;
  undefined1 auVar5 [12];
  
  target_size = (Vector2f)edge_margin;
  VStack_38 = Box::GetSize(box,Border);
  memset(&target_local,0,0x10);
  for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
    pvVar1 = ::std::array<Rml::NumericValue,_4UL>::operator[]
                       ((array<Rml::NumericValue,_4UL> *)target_size,(long)local_3c);
    if (pvVar1->unit == UNKNOWN) {
      local_48 = -3.4028235e+38;
    }
    else {
      pvVar1 = ::std::array<Rml::NumericValue,_4UL>::operator[]
                         ((array<Rml::NumericValue,_4UL> *)target_size,(long)local_3c);
      value.number = pvVar1->number;
      value.unit = pvVar1->unit;
      pfVar2 = Vector2::operator_cast_to_float_((Vector2 *)&stack0xffffffffffffffc8);
      value_00 = Element::ResolveNumericValue
                           (target,value,pfVar2[(int)(uint)(local_3c != 3 && local_3c != 1)]);
      local_48 = Math::Round(value_00);
    }
    pvVar3 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)&target_local,(long)local_3c)
    ;
    *pvVar3 = local_48;
  }
  AVar4._M_elems[0] = target_local._0_4_;
  auVar5._4_4_ = target_local._4_4_;
  AVar4._M_elems[2] = resolved_edge_margin._M_elems[0];
  AVar4._M_elems[3] = resolved_edge_margin._M_elems[1];
  return (Array<float,_NUM_EDGES>)AVar4._M_elems;
}

Assistant:

static Array<float, NUM_EDGES> ResolveEdgeMargin(Element* target, const Box& box, const Array<NumericValue, NUM_EDGES>& edge_margin)
	{
		const Vector2f target_size = box.GetSize(BoxArea::Border);
		Array<float, NUM_EDGES> resolved_edge_margin = {};
		for (int i = 0; i < NUM_EDGES; i++)
		{
			resolved_edge_margin[i] = (edge_margin[i].unit == Unit::UNKNOWN
					? -FLT_MAX
					: Math::Round(target->ResolveNumericValue(edge_margin[i], target_size[(i == LEFT || i == RIGHT) ? 0 : 1])));
		}
		return resolved_edge_margin;
	}